

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

Type * __thiscall slang::ast::Type::getArrayElementType(Type *this)

{
  Type *pTVar1;
  uint uVar2;
  
  pTVar1 = getCanonicalType(this);
  uVar2 = (pTVar1->super_Symbol).kind - PackedArrayType;
  if (uVar2 < 6) {
    pTVar1 = *(Type **)((long)&(pTVar1->super_Symbol).kind +
                       *(long *)(&DAT_0054c760 + (ulong)uVar2 * 8));
  }
  else {
    pTVar1 = (Type *)0x0;
  }
  return pTVar1;
}

Assistant:

const Type* Type::getArrayElementType() const {
    const Type& t = getCanonicalType();
    switch (t.kind) {
        case SymbolKind::PackedArrayType:
            return &t.as<PackedArrayType>().elementType;
        case SymbolKind::FixedSizeUnpackedArrayType:
            return &t.as<FixedSizeUnpackedArrayType>().elementType;
        case SymbolKind::DynamicArrayType:
            return &t.as<DynamicArrayType>().elementType;
        case SymbolKind::DPIOpenArrayType:
            return &t.as<DPIOpenArrayType>().elementType;
        case SymbolKind::AssociativeArrayType:
            return &t.as<AssociativeArrayType>().elementType;
        case SymbolKind::QueueType:
            return &t.as<QueueType>().elementType;
        default:
            return nullptr;
    }
}